

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Sim3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Ssw_RarPars_t Pars;
  Ssw_RarPars_t local_90;
  
  Ssw_RarSetDefaultParams(&local_90);
  Extra_UtilGetoptReset();
LAB_002296c8:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FWBRSNTGgvh");
    iVar3 = globalUtilOptind;
    if (iVar1 < 0x4e) {
      if (iVar1 < 0x46) {
        if (iVar1 != 0x42) {
          if (iVar1 == -1) {
            p = pAbc->pGia;
            if (p != (Gia_Man_t *)0x0) {
              if (p->nRegs != 0) {
                iVar3 = Ssw_RarSimulateGia(p,&local_90);
                pAbc->Status = iVar3;
                Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
                return 0;
              }
              Abc_Print(-1,"Abc_CommandAbc9Sim3(): This command works only for sequential AIGs.\n");
              return 0;
            }
            pcVar4 = "Abc_CommandAbc9Sim3(): There is no AIG.\n";
            iVar3 = -1;
            goto LAB_002299f0;
          }
          goto switchD_002296e9_caseD_4f;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-B\" should be followed by an integer.\n";
          goto LAB_002298c5;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_90.nBinSize = uVar2;
      }
      else if (iVar1 == 0x46) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_002298c5;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_90.nFrames = uVar2;
      }
      else {
        if (iVar1 != 0x47) goto switchD_002296e9_caseD_4f;
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-G\" should be followed by an integer.\n";
          goto LAB_002298c5;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_90.TimeOutGap = uVar2;
      }
    }
    else {
      switch(iVar1) {
      case 0x4e:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_002298c5:
          Abc_Print(-1,pcVar4);
          goto switchD_002296e9_caseD_4f;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_90.nRandSeed = uVar2;
        break;
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x55:
      case 0x56:
        goto switchD_002296e9_caseD_4f;
      case 0x52:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
          goto LAB_002298c5;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_90.nRounds = uVar2;
        break;
      case 0x53:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
          goto LAB_002298c5;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_90.nRestart = uVar2;
        break;
      case 0x54:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
          goto LAB_002298c5;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_90.TimeOut = uVar2;
        break;
      case 0x57:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_002298c5;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_90.nWords = uVar2;
        break;
      default:
        if (iVar1 == 0x67) {
          local_90.fUseFfGrouping = local_90.fUseFfGrouping ^ 1;
        }
        else {
          if (iVar1 != 0x76) goto switchD_002296e9_caseD_4f;
          local_90.fVerbose = local_90.fVerbose ^ 1;
        }
        goto LAB_002296c8;
      }
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
switchD_002296e9_caseD_4f:
      Abc_Print(-2,"usage: &sim3 [-FWBRNT num] [-gvh]\n");
      Abc_Print(-2,"\t         performs random simulation of the sequential miter\n");
      Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",
                (ulong)(uint)local_90.nFrames);
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                (ulong)(uint)local_90.nWords);
      Abc_Print(-2,"\t-B num : the number of flops in one bin [default = %d]\n",
                (ulong)(uint)local_90.nBinSize);
      Abc_Print(-2,"\t-R num : the number of simulation rounds [default = %d]\n",
                (ulong)(uint)local_90.nRounds);
      Abc_Print(-2,"\t-S num : the number of rounds before a restart [default = %d]\n",
                (ulong)(uint)local_90.nRestart);
      Abc_Print(-2,"\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",
                (ulong)(uint)local_90.nRandSeed);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)local_90.TimeOut);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_90.fUseFfGrouping == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-g     : toggle heuristic flop grouping [default = %s]\n",pcVar4);
      if (local_90.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_002299f0:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Sim3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Ssw_RarSimulateGia( Gia_Man_t * p, Ssw_RarPars_t * pPars );
    Ssw_RarPars_t Pars, * pPars = &Pars;
    int c;
    Ssw_RarSetDefaultParams( pPars );
    // parse command line
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWBRSNTGgvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBinSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBinSize < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRestart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRestart < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRandSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRandSeed < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOut < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGap < 0 )
                goto usage;
            break;
        case 'g':
            pPars->fUseFfGrouping ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sim3(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sim3(): This command works only for sequential AIGs.\n" );
        return 0;
    }
    pAbc->Status = Ssw_RarSimulateGia( pAbc->pGia, pPars );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &sim3 [-FWBRNT num] [-gvh]\n" );
    Abc_Print( -2, "\t         performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n",       pPars->nFrames );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n",        pPars->nWords );
    Abc_Print( -2, "\t-B num : the number of flops in one bin [default = %d]\n",         pPars->nBinSize );
    Abc_Print( -2, "\t-R num : the number of simulation rounds [default = %d]\n",        pPars->nRounds );
    Abc_Print( -2, "\t-S num : the number of rounds before a restart [default = %d]\n",  pPars->nRestart );
    Abc_Print( -2, "\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",  pPars->nRandSeed );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n",   pPars->TimeOut );
    Abc_Print( -2, "\t-g     : toggle heuristic flop grouping [default = %s]\n",    pPars->fUseFfGrouping? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",    pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}